

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O2

Own<kj::(anonymous_namespace)::InMemoryDirectory> __thiscall
kj::atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
          (kj *this,Clock *params)

{
  undefined8 *puVar1;
  AtomicRefcounted *refcounted;
  undefined1 auVar2 [16];
  Own<kj::(anonymous_namespace)::InMemoryDirectory> OVar3;
  
  puVar1 = (undefined8 *)operator_new(0x70);
  *(undefined4 *)(puVar1 + 2) = 0;
  *puVar1 = &PTR_getFd_002a7a50;
  puVar1[1] = &PTR_disposeImpl_002a7b28;
  _::Mutex::Mutex((Mutex *)(puVar1 + 3));
  puVar1[6] = params;
  *(undefined4 *)(puVar1 + 8) = 0;
  puVar1[9] = 0;
  puVar1[10] = puVar1 + 8;
  puVar1[0xb] = puVar1 + 8;
  puVar1[0xc] = 0;
  auVar2 = (*(code *)**(undefined8 **)params)(params);
  OVar3.ptr = auVar2._8_8_;
  puVar1[0xd] = auVar2._0_8_;
  LOCK();
  *(int *)(puVar1 + 2) = *(int *)(puVar1 + 2) + 1;
  UNLOCK();
  *(undefined8 **)this = puVar1 + 1;
  *(undefined8 **)(this + 8) = puVar1;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

inline kj::Own<T> atomicRefcounted(Params&&... params) {
  return AtomicRefcounted::addRefInternal(new T(kj::fwd<Params>(params)...));
}